

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O0

float glu::TextureTestUtil::computeLodFromDerivates
                (LodMode mode,float dudx,float dvdx,float dudy,float dvdy)

{
  float fVar1;
  float fVar2;
  undefined4 local_3c;
  float mv;
  float mu;
  float p;
  float dvdy_local;
  float dudy_local;
  float dvdx_local;
  float dudx_local;
  LodMode mode_local;
  
  mv = 0.0;
  if (mode == LODMODE_EXACT) {
    fVar2 = ::deFloatSqrt(dudx * dudx + dvdx * dvdx);
    fVar1 = ::deFloatSqrt(dudy * dudy + dvdy * dvdy);
    mv = de::max<float>(fVar2,fVar1);
  }
  else if (mode - LODMODE_MIN_BOUND < 2) {
    fVar2 = deFloatAbs(dudx);
    fVar1 = deFloatAbs(dudy);
    local_3c = de::max<float>(fVar2,fVar1);
    fVar2 = deFloatAbs(dvdx);
    fVar1 = deFloatAbs(dvdy);
    fVar2 = de::max<float>(fVar2,fVar1);
    if (mode == LODMODE_MIN_BOUND) {
      local_3c = de::max<float>(local_3c,fVar2);
    }
    else {
      local_3c = local_3c + fVar2;
    }
    mv = local_3c;
  }
  fVar2 = deFloatLog2(mv);
  return fVar2;
}

Assistant:

float computeLodFromDerivates (LodMode mode, float dudx, float dvdx, float dudy, float dvdy)
{
	float p = 0.0f;
	switch (mode)
	{
		case LODMODE_EXACT:
			p = de::max(deFloatSqrt(dudx*dudx + dvdx*dvdx), deFloatSqrt(dudy*dudy + dvdy*dvdy));
			break;

		case LODMODE_MIN_BOUND:
		case LODMODE_MAX_BOUND:
		{
			float mu = de::max(deFloatAbs(dudx), deFloatAbs(dudy));
			float mv = de::max(deFloatAbs(dvdx), deFloatAbs(dvdy));

			p = mode == LODMODE_MIN_BOUND ? de::max(mu, mv) : mu + mv;
			break;
		}

		default:
			DE_ASSERT(DE_FALSE);
	}

	return deFloatLog2(p);
}